

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  vec3 lookfrom;
  vec3 lookat;
  vec3 vup;
  int iVar1;
  ostream *poVar2;
  int iVar3;
  shared_ptr<hittable> lights;
  hittable_list world;
  ray r;
  camera cam;
  undefined1 local_221;
  int local_220;
  int local_21c;
  vec3 local_218;
  double local_200;
  double local_1f8;
  double local_1f0;
  shared_ptr<hittable> local_1e8;
  int local_1d4 [3];
  vec3 local_1c8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  vec3 local_168;
  hittable local_148;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> local_140;
  ray local_128;
  camera local_f0;
  
  cornell_box_plus();
  local_168.e[2] = 0.0;
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  local_218.e[0] = (double)CONCAT44(local_218.e[0]._4_4_,0xd5);
  local_1c8.e[0]._0_4_ = 0x157;
  local_1d4[2] = 0xe3;
  local_1d4[1] = 0x14c;
  local_1d4[0] = 0x22a;
  local_128.orig.e[0] = 0.0;
  local_128.orig.e[1] = 0.0;
  local_f0.origin.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xz_rect,std::allocator<xz_rect>,int,int,int,int,int,std::shared_ptr<material>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0.origin.e + 1),
             (xz_rect **)&local_f0,(allocator<xz_rect> *)&local_221,(int *)&local_218,
             (int *)&local_1c8,local_1d4 + 2,local_1d4 + 1,local_1d4,
             (shared_ptr<material> *)&local_128);
  local_1e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f0.origin.e[0];
  local_1e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0.origin.e[1];
  local_f0.origin.e[0] = 0.0;
  local_f0.origin.e[1] = 0.0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128.orig.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128.orig.e[1]);
  }
  local_180 = 0x4071600000000000;
  uStack_178 = 0x4071600000000000;
  local_170 = 0xc089000000000000;
  local_198 = 0x4071600000000000;
  uStack_190 = 0x4071600000000000;
  local_188 = 0;
  local_1b0 = 0;
  uStack_1a8 = 0x3ff0000000000000;
  local_1a0 = 0;
  lookfrom.e[1] = 278.0;
  lookfrom.e[0] = 278.0;
  lookfrom.e[2] = -800.0;
  lookat.e[1] = 278.0;
  lookat.e[0] = 278.0;
  lookat.e[2] = 0.0;
  vup.e[2] = 0.0;
  vup.e[0] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,0);
  vup.e[1] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,8);
  camera::camera(&local_f0,lookfrom,lookat,vup,40.0,2.0,1.0,10.0,0.0,1.0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P3\n",3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,200);
  local_128.orig.e[0] = (double)CONCAT71(local_128.orig.e[0]._1_7_,0x20);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_128,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n255\n",5);
  iVar3 = 99;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\rScanlines remaining: ",0x16);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
    local_128.orig.e[0] = (double)CONCAT71(local_128.orig.e[0]._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_128,1);
    std::ostream::flush();
    local_200 = (double)iVar3;
    iVar1 = 0;
    local_220 = iVar3;
    do {
      local_1f8 = (double)iVar1;
      local_218.e[0] = 0.0;
      local_218.e[1] = 0.0;
      local_218.e[2] = 0.0;
      iVar3 = 100;
      local_21c = iVar1;
      do {
        iVar1 = rand();
        local_1f0 = ((double)iVar1 * 4.656612873077393e-10 + local_1f8) / 200.0;
        iVar1 = rand();
        camera::get_ray(&local_128,&local_f0,local_1f0,
                        ((double)iVar1 * 4.656612873077393e-10 + local_200) / 100.0);
        ray_color(&local_1c8,&local_128,&local_168,&local_148,&local_1e8,0x32);
        local_218.e[0] =
             (double)CONCAT44(local_1c8.e[0]._4_4_,local_1c8.e[0]._0_4_) + local_218.e[0];
        local_218.e[1] = local_1c8.e[1] + local_218.e[1];
        local_218.e[2] = local_1c8.e[2] + local_218.e[2];
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      vec3::write_color(&local_218,(ostream *)&std::cout,100);
      iVar1 = local_21c + 1;
    } while (iVar1 != 200);
    iVar3 = local_220 + -1;
  } while (local_220 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nDone.\n",7);
  if (local_1e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  local_148._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&local_140);
  return 0;
}

Assistant:

int main() {

    // Image
    const int image_width = 200;
    const int image_height = 100;
    const int samples_per_pixel = 100;
    const int max_depth = 50;
    const auto aspect_ratio = double(image_width) / image_height;

    // World
    //auto world = random_scene();
    //auto world = two_spheres();
    //auto world = two_perlin_spheres();
    //auto world = earth();
    //auto world = simple_light();
    //auto world = cornell_box();
    //auto world = cornell_smoke();
    //auto world = final_scene();
    auto world = cornell_box_plus();

    const vec3 background(0, 0, 0);
    shared_ptr<hittable> lights =
            make_shared<xz_rect>(213, 343, 227, 332, 554, shared_ptr<material>());

    // Camera
    vec3 lookfrom(278, 278, -800);
    vec3 lookat(278, 278, 0);
    vec3 vup(0, 1, 0);
    auto dist_to_focus = 10.0;
    auto aperture = 1.0;
    auto vfov = 40.0;
    auto time0 = 0.0;
    auto time1 = 1.0;

    camera cam(lookfrom, lookat, vup, vfov, aspect_ratio, aperture, dist_to_focus, time0, time1);

    // Render
    std::cout << "P3\n" << image_width << ' ' << image_height << "\n255\n";

    for (int j = image_height - 1; j >= 0; --j) {
        std::cerr << "\rScanlines remaining: " << j << ' ' << std::flush;
        for (int i = 0; i < image_width; ++i) {
            vec3 color(0,0,0);
            for (int s = 0; s < samples_per_pixel; ++s) {
                auto u = (i + random_double()) / image_width;
                auto v = (j + random_double()) / image_height;
                ray r = cam.get_ray(u,v);
                color += ray_color(r, background, world, lights, max_depth);
            }
            color.write_color(std::cout,samples_per_pixel);
        }
    }

    std::cerr << "\nDone.\n";
}